

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

sample_type __thiscall
charls::jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::decoder_strategy>
::do_regular(jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::decoder_strategy>
             *this,int32_t qs,int32_t param_2,int32_t predicted,decoder_strategy *param_4)

{
  uchar uVar1;
  int32_t iVar2;
  int32_t iVar3;
  int i;
  int32_t iVar4;
  uint32_t uVar5;
  int32_t mapped_error;
  uint uVar6;
  reference this_00;
  const_reference this_01;
  golomb_code *this_02;
  void *extraout_RDX;
  void *__n;
  golomb_code *code;
  int32_t error_value;
  int32_t predicted_value;
  int32_t k;
  context_regular_mode *context;
  int32_t sign;
  decoder_strategy *param_4_local;
  int32_t predicted_local;
  int32_t param_2_local;
  int32_t qs_local;
  jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::decoder_strategy>
  *this_local;
  
  iVar2 = bit_wise_sign(qs);
  iVar3 = apply_sign(qs,iVar2);
  __n = (void *)(long)iVar3;
  this_00 = std::array<charls::context_regular_mode,_365UL>::operator[]
                      (&this->contexts_,(size_type)__n);
  iVar3 = context_regular_mode::get_golomb_coding_parameter(this_00);
  i = context_regular_mode::c(this_00,__n,extraout_RDX);
  iVar4 = apply_sign(i,iVar2);
  iVar4 = lossless_traits_impl<unsigned_char,_8>::correct_prediction(predicted + iVar4);
  this_01 = std::array<charls::golomb_code_table,_16UL>::operator[]
                      ((array<charls::golomb_code_table,_16UL> *)decoding_tables,(long)iVar3);
  uVar5 = decoder_strategy::peek_byte(&this->super_decoder_strategy);
  this_02 = golomb_code_table::get(this_01,uVar5);
  uVar5 = golomb_code::length(this_02);
  if (uVar5 == 0) {
    mapped_error = decode_value(this,iVar3,0x20,8);
    code._4_4_ = unmap_error_value(mapped_error);
    uVar6 = code._4_4_;
    if ((int)code._4_4_ < 1) {
      uVar6 = -code._4_4_;
    }
    if (0xffff < (int)uVar6) {
      impl::throw_jpegls_error(InvalidCompressedData);
    }
  }
  else {
    uVar5 = golomb_code::length(this_02);
    decoder_strategy::skip(&this->super_decoder_strategy,uVar5);
    code._4_4_ = golomb_code::value(this_02);
    uVar6 = code._4_4_;
    if ((int)code._4_4_ < 1) {
      uVar6 = -code._4_4_;
    }
    if (0xfffe < (int)uVar6) {
      __assert_fail("std::abs(error_value) < 65535",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/scan.h"
                    ,0x13f,
                    "sample_type charls::jls_codec<charls::lossless_traits<charls::quad<unsigned char>, 8>, charls::decoder_strategy>::do_regular(const int32_t, int32_t, const int32_t, decoder_strategy *) [Traits = charls::lossless_traits<charls::quad<unsigned char>, 8>, Strategy = charls::decoder_strategy]"
                   );
    }
  }
  if (iVar3 == 0) {
    uVar6 = context_regular_mode::get_error_correction(this_00,0);
    code._4_4_ = code._4_4_ ^ uVar6;
  }
  context_regular_mode::update_variables_and_bias(this_00,code._4_4_,0,0x40);
  iVar2 = apply_sign(code._4_4_,iVar2);
  uVar1 = lossless_traits<charls::quad<unsigned_char>,_8>::compute_reconstructed_sample(iVar4,iVar2)
  ;
  return uVar1;
}

Assistant:

do_regular(const int32_t qs, int32_t /*x*/, const int32_t predicted,
                                        decoder_strategy* /*template_selector*/)
    {
        const int32_t sign{bit_wise_sign(qs)};
        context_regular_mode& context{contexts_[apply_sign(qs, sign)]};
        const int32_t k{context.get_golomb_coding_parameter()};
        const int32_t predicted_value{traits_.correct_prediction(predicted + apply_sign(context.c(), sign))};

        int32_t error_value;
        const golomb_code& code = decoding_tables[k].get(Strategy::peek_byte());
        if (code.length() != 0)
        {
            Strategy::skip(code.length());
            error_value = code.value();
            ASSERT(std::abs(error_value) < 65535);
        }
        else
        {
            error_value = unmap_error_value(decode_value(k, traits_.limit, traits_.quantized_bits_per_pixel));
            if (UNLIKELY(std::abs(error_value) > 65535))
                impl::throw_jpegls_error(jpegls_errc::invalid_encoded_data);
        }
        if (k == 0)
        {
            error_value = error_value ^ context.get_error_correction(traits_.near_lossless);
        }
        context.update_variables_and_bias(error_value, traits_.near_lossless, traits_.reset_threshold);
        error_value = apply_sign(error_value, sign);
        return traits_.compute_reconstructed_sample(predicted_value, error_value);
    }